

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoPrepare(Gia_IsoMan_t *p)

{
  int *piVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  word *pwVar5;
  void *__ptr;
  undefined4 *__ptr_00;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  piVar1 = p->pLevels;
  *piVar1 = 0;
  pGVar2 = p->pGia;
  pVVar3 = pGVar2->vCis;
  if (0 < pVVar3->nSize) {
    piVar4 = pVVar3->pArray;
    lVar8 = 0;
    do {
      iVar13 = piVar4[lVar8];
      if (((long)iVar13 < 0) || (pGVar2->nObjs <= iVar13)) goto LAB_00712af0;
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
      piVar1[iVar13] = 0;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar3->nSize);
  }
  if ((0 < pGVar2->nObjs) && (pGVar6 = pGVar2->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar8 = 0;
    lVar11 = 0;
    do {
      uVar9 = *(ulong *)pGVar6;
      if ((~(uint)uVar9 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar9) {
        iVar13 = *(int *)((long)piVar1 +
                         ((long)((uVar9 & 0x1fffffff) * -0x100000000 + lVar8) >> 0x1e));
        iVar12 = *(int *)((long)piVar1 +
                         ((long)((uVar9 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar8) >> 0x1e));
        if (iVar12 < iVar13) {
          iVar12 = iVar13;
        }
        piVar1[lVar11] = iVar12 + 1;
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x100000000;
      pGVar6 = pGVar6 + 1;
    } while (lVar11 < pGVar2->nObjs);
  }
  pVVar3 = pGVar2->vCos;
  if (pVVar3->nSize < 1) {
    iVar13 = 0;
  }
  else {
    piVar4 = pVVar3->pArray;
    lVar8 = 0;
    iVar13 = 0;
    do {
      iVar12 = piVar4[lVar8];
      lVar11 = (long)iVar12;
      if ((lVar11 < 0) || (pGVar2->nObjs <= iVar12)) {
LAB_00712af0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
      iVar10 = piVar1[(int)(iVar12 - (*(uint *)(pGVar2->pObjs + lVar11) & 0x1fffffff))] + 1;
      piVar1[lVar11] = iVar10;
      if (pGVar2->nObjs <= iVar12) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (iVar13 <= iVar10) {
        iVar13 = iVar10;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar3->nSize);
  }
  uVar9 = (ulong)(iVar13 + 1);
  __ptr = calloc(uVar9,4);
  iVar12 = p->nObjs;
  if (1 < (long)iVar12) {
    lVar8 = 1;
    do {
      piVar4 = (int *)((long)__ptr + (long)piVar1[lVar8] * 4);
      *piVar4 = *piVar4 + 1;
      lVar8 = lVar8 + 1;
    } while (iVar12 != lVar8);
  }
  pVVar3 = p->vClasses;
  pVVar3->nSize = 0;
  uVar7 = 0;
  Vec_IntPush(pVVar3,0);
  Vec_IntPush(p->vClasses,1);
  __ptr_00 = (undefined4 *)calloc((ulong)(iVar13 + 2),4);
  *__ptr_00 = 1;
  do {
    iVar13 = *(int *)((long)__ptr + uVar7 * 4);
    if (iVar13 < 1) {
      __assert_fail("pLevSizes[i] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                    ,0xeb,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
    }
    iVar12 = __ptr_00[uVar7];
    Vec_IntPush(p->vClasses,iVar12);
    Vec_IntPush(p->vClasses,iVar13);
    __ptr_00[uVar7 + 1] = iVar12 + iVar13;
    uVar7 = uVar7 + 1;
  } while (uVar9 != uVar7);
  if (__ptr_00[uVar9] != p->nObjs) {
    __assert_fail("pLevBegins[MaxLev+1] == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                  ,0xf0,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
  }
  if (1 < p->nObjs) {
    piVar1 = p->pLevels;
    pwVar5 = p->pStoreW;
    lVar8 = 1;
    do {
      iVar13 = __ptr_00[piVar1[lVar8]];
      __ptr_00[piVar1[lVar8]] = iVar13 + 1;
      *(int *)((long)pwVar5 + (long)iVar13 * 8 + 4) = (int)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  free(__ptr_00);
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_IsoPrepare( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int * pLevBegins, * pLevSizes;
    int i, iObj, MaxLev = 0;
    // assign levels
    p->pLevels[0] = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        p->pLevels[Gia_ObjId(p->pGia, pObj)] = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        p->pLevels[i] = 1 + Abc_MaxInt( p->pLevels[Gia_ObjFaninId0(pObj, i)], p->pLevels[Gia_ObjFaninId1(pObj, i)] );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        p->pLevels[iObj] = 1 + p->pLevels[Gia_ObjFaninId0(pObj, iObj)]; // "1 +" is different!
        MaxLev = Abc_MaxInt( MaxLev, p->pLevels[Gia_ObjId(p->pGia, pObj)] );
    }

    // count nodes on each level
    pLevSizes = ABC_CALLOC( int, MaxLev+1 );
    for ( i = 1; i < p->nObjs; i++ )
        pLevSizes[p->pLevels[i]]++;
    // start classes
    Vec_IntClear( p->vClasses );
    Vec_IntPush( p->vClasses, 0 );
    Vec_IntPush( p->vClasses, 1 );
    // find beginning of each level
    pLevBegins = ABC_CALLOC( int, MaxLev+2 );
    pLevBegins[0] = 1;
    for ( i = 0; i <= MaxLev; i++ )
    {
        assert( pLevSizes[i] > 0 ); // we do not allow AIG with a const node and no PIs
        Vec_IntPush( p->vClasses, pLevBegins[i] );
        Vec_IntPush( p->vClasses, pLevSizes[i] );
        pLevBegins[i+1] = pLevBegins[i] + pLevSizes[i];
    }
    assert( pLevBegins[MaxLev+1] == p->nObjs );
    // put them into the structure
    for ( i = 1; i < p->nObjs; i++ )
        Gia_IsoSetItem( p, pLevBegins[p->pLevels[i]]++, i );
    ABC_FREE( pLevBegins );
    ABC_FREE( pLevSizes );
/*
    // print the results
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d : (%d,%d)\n", i, Gia_IsoGetItem(p, i), Gia_IsoGetValue(p, i) );
    printf( "\n" );
*/
}